

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  cmSourceFile *pcVar1;
  cmake *this_00;
  size_type sVar2;
  pointer ppcVar3;
  bool bVar4;
  string *psVar5;
  cmCustomCommand *pcVar6;
  ostream *poVar7;
  cmSourceFileLocation *pcVar8;
  pointer ppcVar9;
  pointer sourceName;
  uint uVar10;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar11;
  cmSourceFile *sf;
  string resx;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_338;
  string hFileName;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  srcs;
  string cppFileName;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  string ext;
  RegularExpression header_regex;
  
  GetSourceFilePaths(&srcs,this,config);
  cmsys::RegularExpression::RegularExpression
            (&header_regex,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (sourceName = srcs.
                    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      sourceName !=
      srcs.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; sourceName = sourceName + 1) {
    sf = cmMakefile::GetOrCreateSource(this->Makefile,&sourceName->Value,false,Ambiguous);
    pVar11 = std::
             _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
             ::_M_insert_unique<cmSourceFile*const&>
                       ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                         *)&emitted,&sf);
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar5 = cmSourceFile::GetExtension_abi_cxx11_(sf);
      cmsys::SystemTools::LowerCase(&ext,psVar5);
      pcVar6 = cmSourceFile::GetCustomCommand(sf);
      pcVar1 = sf;
      uVar10 = 2;
      if ((pcVar6 == (cmCustomCommand *)0x0) &&
         (uVar10 = 4, this->Target->TargetTypeValue != UTILITY)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&resx,"HEADER_FILE_ONLY",(allocator<char> *)&hFileName);
        bVar4 = cmSourceFile::GetPropertyAsBool(pcVar1,&resx);
        std::__cxx11::string::~string((string *)&resx);
        pcVar1 = sf;
        uVar10 = 5;
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&resx,"EXTERNAL_OBJECT",(allocator<char> *)&hFileName);
          bVar4 = cmSourceFile::GetPropertyAsBool(pcVar1,&resx);
          std::__cxx11::string::~string((string *)&resx);
          uVar10 = 3;
          if (!bVar4) {
            cmSourceFile::GetLanguage_abi_cxx11_(&resx,sf);
            sVar2 = resx._M_string_length;
            std::__cxx11::string::~string((string *)&resx);
            uVar10 = 9;
            if (sVar2 == 0) {
              bVar4 = std::operator==(&ext,"def");
              if (bVar4) {
                uVar10 = 8;
                if (this->Target->TargetTypeValue == OBJECT_LIBRARY) {
                  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                            (&badObjLib,&sf);
                  uVar10 = 8;
                }
              }
              else {
                bVar4 = std::operator==(&ext,"idl");
                if (bVar4) {
                  uVar10 = 6;
                  if (this->Target->TargetTypeValue == OBJECT_LIBRARY) {
                    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                              (&badObjLib,&sf);
                    uVar10 = 6;
                  }
                }
                else {
                  bVar4 = std::operator==(&ext,"resx");
                  if (bVar4) {
                    psVar5 = cmSourceFile::GetFullPath(sf,(string *)0x0);
                    std::__cxx11::string::string((string *)&resx,(string *)psVar5);
                    std::__cxx11::string::rfind((char)&resx,0x2e);
                    std::__cxx11::string::substr((ulong)&cppFileName,(ulong)&resx);
                    std::operator+(&hFileName,&cppFileName,".h");
                    std::__cxx11::string::~string((string *)&cppFileName);
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&files->ExpectedResxHeaders,&hFileName);
                    std::__cxx11::string::~string((string *)&hFileName);
                    std::__cxx11::string::~string((string *)&resx);
                    uVar10 = 10;
                  }
                  else {
                    bVar4 = std::operator==(&ext,"appxmanifest");
                    uVar10 = 0;
                    if (!bVar4) {
                      bVar4 = std::operator==(&ext,"manifest");
                      uVar10 = 7;
                      if (!bVar4) {
                        bVar4 = std::operator==(&ext,"pfx");
                        uVar10 = 1;
                        if (!bVar4) {
                          bVar4 = std::operator==(&ext,"xaml");
                          if (bVar4) {
                            psVar5 = cmSourceFile::GetFullPath(sf,(string *)0x0);
                            std::__cxx11::string::string((string *)&resx,(string *)psVar5);
                            std::operator+(&hFileName,&resx,".h");
                            std::operator+(&cppFileName,&resx,".cpp");
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string_const&>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&files->ExpectedXamlHeaders,&hFileName);
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string_const&>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&files->ExpectedXamlSources,&cppFileName);
                            std::__cxx11::string::~string((string *)&cppFileName);
                            std::__cxx11::string::~string((string *)&hFileName);
                            std::__cxx11::string::~string((string *)&resx);
                            uVar10 = 0xb;
                          }
                          else {
                            psVar5 = cmSourceFile::GetFullPath(sf,(string *)0x0);
                            bVar4 = cmsys::RegularExpression::find(&header_regex,psVar5);
                            uVar10 = bVar4 | 4;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      pcVar1 = sf;
      std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_338,
                 (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
                 &sourceName->Backtrace);
      resx._M_dataplus._M_p = (pointer)pcVar1;
      resx._M_string_length = (size_type)local_338._M_ptr;
      resx.field_2._M_allocated_capacity = (size_type)local_338._M_refcount._M_pi;
      local_338._M_ptr = (element_type *)0x0;
      local_338._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      resx.field_2._8_4_ = uVar10;
      std::
      vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
      emplace_back<cmGeneratorTarget::SourceAndKind>(&files->Sources,(SourceAndKind *)&resx);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&resx.field_2._M_allocated_capacity);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount);
      std::__cxx11::string::~string((string *)&ext);
    }
  }
  if (badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ext);
    poVar7 = std::operator<<((ostream *)&ext,"OBJECT library \"");
    poVar7 = std::operator<<(poVar7,(string *)&this->Target->Name);
    std::operator<<(poVar7,"\" contains:\n");
    ppcVar3 = badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar9 = badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar9 != ppcVar3;
        ppcVar9 = ppcVar9 + 1) {
      pcVar1 = *ppcVar9;
      poVar7 = std::operator<<((ostream *)&ext,"  ");
      pcVar8 = cmSourceFile::GetLocation(pcVar1);
      poVar7 = std::operator<<(poVar7,(string *)&pcVar8->Name);
      std::operator<<(poVar7,"\n");
    }
    std::operator<<((ostream *)&ext,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmGeneratorTarget *)&hFileName);
    cmake::IssueMessage(this_00,FATAL_ERROR,&resx,(cmListFileBacktrace *)&hFileName);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&hFileName._M_string_length);
    std::__cxx11::string::~string((string *)&resx);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ext);
  }
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree(&emitted._M_t);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  cmsys::RegularExpression::~RegularExpression(&header_regex);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&srcs);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<BT<std::string>> srcs = this->GetSourceFilePaths(config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (BT<std::string> const& s : srcs) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(s.Value);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY) {
      kind = SourceKindExtra;
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
    } else if (!sf->GetLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
      // Build and save the name of the corresponding .h file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string resx = sf->GetFullPath();
      std::string hFileName = resx.substr(0, resx.find_last_of('.')) + ".h";
      files.ExpectedResxHeaders.insert(hFileName);
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      kind = SourceKindManifest;
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
      // Build and save the name of the corresponding .h and .cpp file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string xaml = sf->GetFullPath();
      std::string hFileName = xaml + ".h";
      std::string cppFileName = xaml + ".cpp";
      files.ExpectedXamlHeaders.insert(hFileName);
      files.ExpectedXamlSources.insert(cppFileName);
    } else if (header_regex.find(sf->GetFullPath())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    files.Sources.push_back({ BT<cmSourceFile*>(sf, s.Backtrace), kind });
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (cmSourceFile* i : badObjLib) {
      e << "  " << i->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}